

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_01;
  UnscannedEntry *pUVar1;
  bool bVar2;
  BOM BVar3;
  const_iterator cVar4;
  iterator iVar5;
  iterator iVar6;
  undefined8 *puVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  char *m1;
  pointer dir_00;
  value_type *__x;
  ulong local_390;
  string fullName;
  string tempPathStr;
  string obj_m;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string dir;
  string obj_i;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  local_390 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if ((local_390 == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    m1 = "Cannot scan dependencies without a source file.";
LAB_003c22fa:
    cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
    return false;
  }
  if (obj->_M_string_length == 0) {
    m1 = "Cannot scan dependencies without an object file.";
    goto LAB_003c22fa;
  }
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (&this->ValidDeps->_M_t !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
       *)0x0) {
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            ::find(&this->ValidDeps->_M_t,obj);
    if ((_Rb_tree_header *)cVar4._M_node != &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&dependencies,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (cVar4._M_node + 2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 cVar4._M_node[2]._M_parent);
LAB_003c27b0:
      cmOutputConverter::Convert
                (&obj_i,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,obj,
                 HOME_OUTPUT,UNCHANGED);
      cmOutputConverter::ConvertToOutputFormat
                (&obj_m,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,&obj_i,
                 MAKERULE);
      poVar10 = std::operator<<(internalDepends,(string *)&obj_i);
      std::endl<char,std::char_traits<char>>(poVar10);
      for (p_Var11 = dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &dependencies._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        poVar10 = std::operator<<(makeDepends,(string *)&obj_m);
        poVar10 = std::operator<<(poVar10,": ");
        cmOutputConverter::Convert
                  ((string *)&scanned,
                   &((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   (string *)(p_Var11 + 1),HOME_OUTPUT,MAKERULE);
        poVar10 = std::operator<<(poVar10,(string *)&scanned);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::string::~string((string *)&scanned);
        poVar10 = std::operator<<(internalDepends," ");
        poVar10 = std::operator<<(poVar10,(string *)(p_Var11 + 1));
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      std::endl<char,std::char_traits<char>>(makeDepends);
      std::__cxx11::string::~string((string *)&obj_m);
      std::__cxx11::string::~string((string *)&obj_i);
      bVar2 = true;
      goto LAB_003c2906;
    }
    local_390 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  this_00 = &this->Encountered;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  this_01 = &this->Unscanned;
  for (p_Var11 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    obj_i._M_dataplus._M_p = (pointer)&obj_i.field_2;
    obj_i._M_string_length = 0;
    obj_i.field_2._M_local_buf[0] = '\0';
    local_218._M_p = (pointer)local_208;
    local_210 = 0;
    local_208[0]._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&obj_i);
    std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::push_back
              (&this_01->c,(UnscannedEntry *)&obj_i);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var11 + 1));
    UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&obj_i);
  }
  scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &scanned._M_t._M_impl.super__Rb_tree_header._M_header;
  scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  scanned._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tempPathStr._M_dataplus._M_p = (pointer)&tempPathStr.field_2;
  tempPathStr._M_string_length = 0;
  tempPathStr.field_2._M_local_buf[0] = '\0';
  scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::reserve((ulong)&tempPathStr);
  do {
    pUVar1 = (this->Unscanned).c.
             super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->Unscanned).c.
        super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar1) {
      std::__cxx11::string::~string((string *)&tempPathStr);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&scanned._M_t);
      goto LAB_003c27b0;
    }
    UnscannedEntry::UnscannedEntry((UnscannedEntry *)&obj_m,pUVar1);
    std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::pop_front
              (&this_01->c);
    fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
    fullName._M_string_length = 0;
    fullName.field_2._M_local_buf[0] = '\0';
    if ((0 < (int)local_390) ||
       (bVar2 = cmsys::SystemTools::FileIsFullPath(obj_m._M_dataplus._M_p), bVar2)) {
      bVar2 = cmsys::SystemTools::FileExists(obj_m._M_dataplus._M_p,true);
      if (bVar2) goto LAB_003c24db;
    }
    else if ((local_2d0 == 0) ||
            (bVar2 = cmsys::SystemTools::FileExists(local_2d8._M_p,true), !bVar2)) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->HeaderLocationCache)._M_t,(key_type *)&obj_m);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header) {
        dir_00 = (this->super_cmDepends).IncludePath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (dir_00 == (this->super_cmDepends).IncludePath.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003c24e5;
          cmSystemTools::CollapseCombinedPath(&obj_i,dir_00,&obj_m);
          std::__cxx11::string::operator=((string *)&tempPathStr,(string *)&obj_i);
          std::__cxx11::string::~string((string *)&obj_i);
          bVar2 = cmsys::SystemTools::FileExists(tempPathStr._M_dataplus._M_p,true);
          dir_00 = dir_00 + 1;
        } while (!bVar2);
        std::__cxx11::string::_M_assign((string *)&fullName);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->HeaderLocationCache,(key_type *)&obj_m);
        std::__cxx11::string::_M_assign((string *)pmVar9);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&fullName);
      }
    }
    else {
LAB_003c24db:
      std::__cxx11::string::_M_assign((string *)&fullName);
    }
LAB_003c24e5:
    if (fullName._M_string_length == 0) {
      bVar2 = cmsys::RegularExpression::find(&this->IncludeRegexComplain,obj_m._M_dataplus._M_p);
      if (!bVar2) {
        if (fullName._M_string_length != 0) goto LAB_003c24ed;
        goto LAB_003c250c;
      }
      bVar2 = false;
      cmSystemTools::Error("Cannot find file \"",obj_m._M_dataplus._M_p,"\".",(char *)0x0);
    }
    else {
LAB_003c24ed:
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&scanned._M_t,&fullName);
      if ((_Rb_tree_header *)iVar5._M_node == &scanned._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&scanned,&fullName);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                ::find(&(this->FileCache)._M_t,&fullName);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(this->FileCache)._M_t._M_impl.super__Rb_tree_header) {
          std::ifstream::ifstream(&obj_i,fullName._M_dataplus._M_p,_S_in);
          if (((*(byte *)((long)&local_218._M_p + *(long *)(obj_i._M_dataplus._M_p + -0x18)) & 5) ==
               0) && (BVar3 = cmsys::FStream::ReadBOM((istream *)&obj_i), BVar3 < BOM_UTF16BE)) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&dependencies,&fullName);
            cmsys::SystemTools::GetFilenamePath(&dir,&fullName);
            Scan(this,(istream *)&obj_i,dir._M_dataplus._M_p,&fullName);
            std::__cxx11::string::~string((string *)&dir);
          }
          std::ifstream::~ifstream(&obj_i);
        }
        else {
          *(undefined1 *)(*(long *)(iVar6._M_node + 2) + 0x18) = 1;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&dependencies,&fullName);
          puVar7 = *(undefined8 **)(iVar6._M_node + 2);
          for (__x = (value_type *)*puVar7; __x != (value_type *)puVar7[1]; __x = __x + 1) {
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&this_00->_M_t,&__x->FileName);
            if ((_Rb_tree_header *)iVar5._M_node ==
                &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)this_00,&__x->FileName);
              std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
              push_back(&this_01->c,__x);
            }
            puVar7 = *(undefined8 **)(iVar6._M_node + 2);
          }
        }
      }
LAB_003c250c:
      local_390 = (ulong)((int)local_390 - 1);
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)&fullName);
    UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&obj_m);
  } while (bVar2);
  std::__cxx11::string::~string((string *)&tempPathStr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&scanned._M_t);
  bVar2 = false;
LAB_003c2906:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&dependencies._M_t);
  return bVar2;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if(sources.empty() || sources.begin()->empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
    }
  if(obj.empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
    }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  if (this->ValidDeps != 0)
    {
    std::map<std::string, DependencyVector>::const_iterator tmpIt =
                                                    this->ValidDeps->find(obj);
    if (tmpIt!= this->ValidDeps->end())
      {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
      }
    }

  if (!haveDeps)
    {
    // Walk the dependency graph starting with the source file.
    int srcFiles = (int)sources.size();
    this->Encountered.clear();

    for(std::set<std::string>::const_iterator srcIt = sources.begin();
        srcIt != sources.end(); ++srcIt)
      {
      UnscannedEntry root;
      root.FileName = *srcIt;
      this->Unscanned.push(root);
      this->Encountered.insert(*srcIt);
      }

    std::set<std::string> scanned;

    // Use reserve to allocate enough memory for tempPathStr
    // so that during the loops no memory is allocated or freed
    std::string tempPathStr;
    tempPathStr.reserve(4*1024);

    while(!this->Unscanned.empty())
      {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if((srcFiles>0)
         || cmSystemTools::FileIsFullPath(current.FileName.c_str()))
        {
        if(cmSystemTools::FileExists(current.FileName.c_str(), true))
          {
          fullName = current.FileName;
          }
        }
      else if(!current.QuotedLocation.empty() &&
              cmSystemTools::FileExists(current.QuotedLocation.c_str(), true))
        {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
        }
      else
        {
        std::map<std::string, std::string>::iterator
          headerLocationIt=this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt!=this->HeaderLocationCache.end())
          {
          fullName=headerLocationIt->second;
          }
        else for(std::vector<std::string>::const_iterator i =
              this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
          {
          // Construct the name of the file as if it were in the current
          // include directory.  Avoid using a leading "./".

          tempPathStr =
            cmSystemTools::CollapseCombinedPath(*i, current.FileName);

          // Look for the file in this location.
          if(cmSystemTools::FileExists(tempPathStr.c_str(), true))
            {
            fullName = tempPathStr;
            HeaderLocationCache[current.FileName]=fullName;
            break;
            }
          }
        }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if(fullName.empty() &&
        this->IncludeRegexComplain.find(current.FileName.c_str()))
        {
        cmSystemTools::Error("Cannot find file \"",
                            current.FileName.c_str(), "\".");
        return false;
        }

      // Scan the file if it was found and has not been scanned already.
      if(!fullName.empty() && (scanned.find(fullName) == scanned.end()))
        {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        std::map<std::string, cmIncludeLines*>::iterator fileIt=
          this->FileCache.find(fullName);
        if (fileIt!=this->FileCache.end())
          {
          fileIt->second->Used=true;
          dependencies.insert(fullName);
          for (std::vector<UnscannedEntry>::const_iterator incIt=
                fileIt->second->UnscannedEntries.begin();
              incIt!=fileIt->second->UnscannedEntries.end(); ++incIt)
            {
            if (this->Encountered.find(incIt->FileName) ==
                this->Encountered.end())
              {
              this->Encountered.insert(incIt->FileName);
              this->Unscanned.push(*incIt);
              }
            }
          }
        else
          {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if(fin)
            {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if(bom == cmsys::FStream::BOM_None ||
               bom == cmsys::FStream::BOM_UTF8)
              {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir.c_str(), fullName);
              }
            else
              {
              // Skip file with encoding we do not implement.
              }
            }
          }
        }

      srcFiles--;
      }
    }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_i =
    this->LocalGenerator->Convert(obj, cmLocalGenerator::HOME_OUTPUT);
  std::string obj_m =
    this->LocalGenerator->ConvertToOutputFormat(obj_i,
                                                cmLocalGenerator::MAKERULE);
  internalDepends << obj_i << std::endl;

  for(std::set<std::string>::const_iterator i=dependencies.begin();
      i != dependencies.end(); ++i)
    {
    makeDepends << obj_m << ": " <<
      this->LocalGenerator->Convert(*i,
                                    cmLocalGenerator::HOME_OUTPUT,
                                    cmLocalGenerator::MAKERULE)
                << std::endl;
    internalDepends << " " << *i << std::endl;
    }
  makeDepends << std::endl;

  return true;
}